

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GetScalarFieldOfTable
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  string getter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  GenGetter_abi_cxx11_(&local_48,this,&(field->value).type);
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[6])(&local_a8,&this->namer_,field);
  std::operator+(&bStack_c8," ",&local_a8);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  TypeName_abi_cxx11_(&local_88,this,field);
  std::operator+(&local_a8,"() ",&local_88);
  std::operator+(&bStack_c8,&local_a8," ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  OffsetPrefix_abi_cxx11_(&bStack_c8,this,field);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_c8);
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&local_68,&local_48,"(o + rcv._tab.Pos)");
  CastToEnum(&bStack_c8,this,&(field->value).type,&local_68);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_c8);
  std::__cxx11::string::~string((string *)&local_68);
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    std::__cxx11::string::append((char *)code_ptr);
  }
  std::__cxx11::string::append((char *)code_ptr);
  GenConstant_abi_cxx11_(&local_88,this,field);
  std::operator+(&local_a8,"\treturn ",&local_88);
  std::operator+(&bStack_c8,&local_a8,"\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void GetScalarFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                             std::string *code_ptr) {
    std::string &code = *code_ptr;
    std::string getter = GenGetter(field.value.type);
    GenReceiver(struct_def, code_ptr);
    code += " " + namer_.Function(field);
    code += "() " + TypeName(field) + " ";
    code += OffsetPrefix(field);
    if (field.IsScalarOptional()) {
      code += "\t\tv := ";
    } else {
      code += "\t\treturn ";
    }
    code += CastToEnum(field.value.type, getter + "(o + rcv._tab.Pos)");
    if (field.IsScalarOptional()) { code += "\n\t\treturn &v"; }
    code += "\n\t}\n";
    code += "\treturn " + GenConstant(field) + "\n";
    code += "}\n\n";
  }